

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_equal_var(secp256k1_fe *a,secp256k1_fe *b)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  secp256k1_ecmult_gen_context *a_00;
  char cVar10;
  int iVar11;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong uVar12;
  long lVar13;
  uchar *in_RCX;
  ulong uVar14;
  secp256k1_ecmult_gen_context *hasher;
  ulong uVar15;
  ulong uVar16;
  secp256k1_pubkey *pubkey;
  secp256k1_ge *extraout_RDX;
  uchar *seckey;
  uint uVar17;
  secp256k1_fe *psVar18;
  uint64_t unaff_RBP;
  ulong uVar19;
  secp256k1_fe *psVar20;
  secp256k1_ge *u32;
  secp256k1_context *ctx;
  secp256k1_ge *elem;
  secp256k1_ecmult_gen_context *psVar21;
  uint64_t unaff_R12;
  uint64_t unaff_R13;
  secp256k1_context *unaff_R15;
  undefined1 auVar22 [16];
  secp256k1_fe na;
  secp256k1_ge sStack_3f8;
  secp256k1_sha256 sStack_390;
  secp256k1_scalar sStack_328;
  secp256k1_fe sStack_308;
  ulong uStack_2d8;
  secp256k1_ge *psStack_2d0;
  ulong uStack_2c8;
  secp256k1_fe *psStack_2c0;
  secp256k1_ecmult_gen_context *psStack_2b8;
  secp256k1_fe *psStack_2b0;
  secp256k1_ge *psStack_2a0;
  secp256k1_ecmult_gen_context *psStack_298;
  long lStack_290;
  secp256k1_fe sStack_288;
  byte abStack_258 [40];
  secp256k1_fe *psStack_230;
  uint64_t uStack_228;
  uint64_t uStack_220;
  uchar *puStack_218;
  secp256k1_context *psStack_210;
  code *pcStack_208;
  size_t sStack_1f8;
  secp256k1_sha256 sStack_1f0;
  undefined1 auStack_180 [176];
  secp256k1_fe sStack_d0;
  secp256k1_fe *psStack_a0;
  secp256k1_fe *psStack_98;
  secp256k1_context *psStack_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  secp256k1_context *local_68;
  secp256k1_fe local_60;
  
  psStack_90 = (secp256k1_context *)0x123341;
  psVar20 = b;
  secp256k1_fe_verify(a);
  psStack_90 = (secp256k1_context *)0x123349;
  ctx = (secp256k1_context *)b;
  secp256k1_fe_verify(b);
  if (a->magnitude < 2) {
    if (0x1f < b->magnitude) goto LAB_00123527;
    psStack_90 = (secp256k1_context *)0x123366;
    ctx = (secp256k1_context *)a;
    secp256k1_fe_verify(a);
    if (1 < a->magnitude) goto LAB_0012352c;
    local_88 = 0x3ffffbfffff0bc - a->n[0];
    psVar18 = (secp256k1_fe *)(0x3ffffffffffffc - a->n[1]);
    unaff_R13 = 0x3ffffffffffffc - a->n[2];
    unaff_R12 = 0x3ffffffffffffc - a->n[3];
    unaff_RBP = 0x3fffffffffffc - a->n[4];
    local_60.magnitude = 2;
    local_60.normalized = 0;
    psStack_90 = (secp256k1_context *)0x1233d9;
    local_68 = (secp256k1_context *)b;
    local_60.n[0] = local_88;
    local_60.n[1] = (uint64_t)psVar18;
    local_60.n[2] = unaff_R13;
    local_60.n[3] = unaff_R12;
    local_60.n[4] = unaff_RBP;
    secp256k1_fe_verify(&local_60);
    unaff_R15 = local_68;
    psStack_90 = (secp256k1_context *)0x1233e6;
    secp256k1_fe_verify(&local_60);
    psStack_90 = (secp256k1_context *)0x1233ee;
    ctx = unaff_R15;
    secp256k1_fe_verify((secp256k1_fe *)unaff_R15);
    iVar11 = (int)(unaff_R15->ecmult_gen_ctx).initial.x.n[0];
    b = psVar18;
    if (iVar11 < 0x1f) {
      local_88 = local_88 + *(long *)&unaff_R15->ecmult_gen_ctx;
      local_80 = (long)psVar18->n + (unaff_R15->ecmult_gen_ctx).blind.d[0];
      local_78 = unaff_R13 + (unaff_R15->ecmult_gen_ctx).blind.d[1];
      local_70 = unaff_R12 + (unaff_R15->ecmult_gen_ctx).blind.d[2];
      uVar19 = unaff_RBP + (unaff_R15->ecmult_gen_ctx).blind.d[3];
      local_60.normalized = 0;
      local_60.magnitude = iVar11 + 2;
      psStack_90 = (secp256k1_context *)0x12346b;
      local_60.n[0] = local_88;
      local_60.n[1] = local_80;
      local_60.n[2] = local_78;
      local_60.n[3] = local_70;
      local_60.n[4] = uVar19;
      secp256k1_fe_verify(&local_60);
      psStack_90 = (secp256k1_context *)0x123473;
      secp256k1_fe_verify(&local_60);
      uVar14 = (uVar19 >> 0x30) * 0x1000003d1 + local_88;
      if (((uVar14 & 0xfffffffffffff) == 0xffffefffffc2f) ||
         (uVar17 = 0, (uVar14 & 0xfffffffffffff) == 0)) {
        uVar12 = (uVar14 >> 0x34) + local_80;
        uVar15 = (uVar12 >> 0x34) + local_78;
        uVar16 = (uVar15 >> 0x34) + local_70;
        uVar19 = (uVar16 >> 0x34) + (uVar19 & 0xffffffffffff);
        uVar17 = (uint)(((uVar14 | 0x1000003d0) & uVar12 & uVar15 & uVar16 &
                        (uVar19 ^ 0xf000000000000)) == 0xfffffffffffff ||
                       ((uVar12 | uVar14 | uVar15 | uVar16) & 0xfffffffffffff) == 0 && uVar19 == 0);
      }
      return uVar17;
    }
  }
  else {
    psStack_90 = (secp256k1_context *)0x123527;
    secp256k1_fe_equal_var_cold_4();
LAB_00123527:
    psStack_90 = (secp256k1_context *)0x12352c;
    secp256k1_fe_equal_var_cold_3();
LAB_0012352c:
    psStack_90 = (secp256k1_context *)0x123531;
    secp256k1_fe_equal_var_cold_2();
  }
  psStack_90 = (secp256k1_context *)secp256k1_ellswift_encode;
  secp256k1_fe_equal_var_cold_1();
  psStack_a0 = b;
  psStack_98 = a;
  psStack_90 = unaff_R15;
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_208 = (code *)0x123668;
    secp256k1_ellswift_encode_cold_5();
LAB_00123668:
    pcStack_208 = (code *)0x12366d;
    secp256k1_ellswift_encode_cold_4();
    return 0;
  }
  if (psVar20 == (secp256k1_fe *)0x0) goto LAB_00123668;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    pcStack_208 = (code *)0x123674;
    secp256k1_ellswift_encode_cold_3();
    return 0;
  }
  if (in_RCX == (uchar *)0x0) {
    pcStack_208 = (code *)0x12367b;
    secp256k1_ellswift_encode_cold_2();
    return 0;
  }
  pcStack_208 = (code *)0x123579;
  iVar11 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(auStack_180 + 0x48),pubkey);
  if (iVar11 == 0) {
    psVar20[1].n[0] = 0;
    psVar20[1].n[1] = 0;
    psVar20->n[4] = 0;
    psVar20->magnitude = 0;
    psVar20->normalized = 0;
    psVar20->n[2] = 0;
    psVar20->n[3] = 0;
    psVar20->n[0] = 0;
    psVar20->n[1] = 0;
    return 0;
  }
  psVar21 = (secp256k1_ecmult_gen_context *)auStack_180;
  auStack_180._48_8_ = 0;
  auStack_180._56_8_ = 0;
  auStack_180._32_8_ = 0;
  auStack_180._40_8_ = 0;
  auStack_180._16_8_ = 0;
  auStack_180._24_8_ = 0;
  auStack_180._0_8_ = 0;
  auStack_180._8_8_ = 0;
  sStack_1f0.s[0] = 0xd1a6524b;
  sStack_1f0.s[1] = 0x28594b3;
  sStack_1f0.s[2] = 0x96e42f4e;
  sStack_1f0.s[3] = 0x1037a177;
  sStack_1f0.s[4] = 0x1b8fcb8b;
  sStack_1f0.s[5] = 0x56023885;
  sStack_1f0.s[6] = 0x2560ede1;
  sStack_1f0.s[7] = 0xd626b715;
  sStack_1f0.bytes = 0x40;
  elem = (secp256k1_ge *)(auStack_180 + 0x48);
  hasher = (secp256k1_ecmult_gen_context *)0x1;
  pcStack_208 = (code *)0x1235d3;
  iVar11 = secp256k1_eckey_pubkey_serialize(elem,(uchar *)psVar21,&sStack_1f8,1);
  if ((iVar11 != 0) && (sStack_1f8 == 0x21)) {
    pcStack_208 = (code *)0x123601;
    secp256k1_sha256_write(&sStack_1f0,auStack_180,0x40);
    pcStack_208 = (code *)0x123611;
    secp256k1_sha256_write(&sStack_1f0,in_RCX,0x20);
    pcStack_208 = (code *)0x12362f;
    secp256k1_ellswift_elligatorswift_var
              ((uchar *)psVar20,&sStack_d0,(secp256k1_ge *)(auStack_180 + 0x48),&sStack_1f0);
    pcStack_208 = (code *)0x12363e;
    secp256k1_fe_get_b32((uchar *)(psVar20->n + 4),&sStack_d0);
    return 1;
  }
  pcStack_208 = secp256k1_ellswift_elligatorswift_var;
  secp256k1_ellswift_encode_cold_1();
  pcStack_208 = (code *)unaff_RBP;
  psStack_210 = unaff_R15;
  puStack_218 = in_RCX;
  uStack_220 = unaff_R13;
  uStack_228 = unaff_R12;
  psStack_230 = psVar20;
  uVar19 = 0;
  lStack_290 = 0x1000003d1;
  uVar14 = 0;
  psStack_2a0 = extraout_RDX;
  psStack_298 = psVar21;
  do {
    iVar11 = (int)uVar14;
    if (iVar11 == 0) {
      psStack_2b0 = (secp256k1_fe *)0x1236d4;
      secp256k1_ellswift_prng(abStack_258,(secp256k1_sha256 *)hasher,(uint32_t)uVar19);
      iVar11 = 0x40;
      uVar19 = (ulong)((uint32_t)uVar19 + 1);
    }
    uVar17 = iVar11 - 1;
    uVar14 = (ulong)uVar17;
    bVar3 = abStack_258[uVar17 >> 1];
    psVar20 = (secp256k1_fe *)(ulong)bVar3;
    psStack_2b0 = (secp256k1_fe *)0x1236f6;
    secp256k1_ellswift_prng((uchar *)elem,(secp256k1_sha256 *)hasher,(uint32_t)uVar19);
    psStack_2b0 = (secp256k1_fe *)0x123701;
    secp256k1_fe_impl_set_b32_mod(&sStack_288,(uchar *)elem);
    sStack_288.magnitude = 1;
    sStack_288.normalized = 0;
    psStack_2b0 = (secp256k1_fe *)0x123712;
    secp256k1_fe_verify(&sStack_288);
    psStack_2b0 = (secp256k1_fe *)0x12371a;
    secp256k1_fe_verify(&sStack_288);
    uVar12 = (sStack_288.n[4] >> 0x30) * lStack_290 + sStack_288.n[0];
    if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
      uVar15 = (uVar12 >> 0x34) + sStack_288.n[1];
      u32 = (secp256k1_ge *)((uVar15 >> 0x34) + sStack_288.n[2]);
      psVar21 = (secp256k1_ecmult_gen_context *)(((ulong)u32 >> 0x34) + sStack_288.n[3]);
      uVar16 = ((ulong)psVar21 >> 0x34) + (sStack_288.n[4] & 0xffffffffffff);
      psVar18 = (secp256k1_fe *)
                ((uVar15 | uVar12 | (ulong)u32 | (ulong)psVar21) & 0xfffffffffffff | uVar16);
      if ((psVar18 == (secp256k1_fe *)0x0) ||
         (psVar18 = (secp256k1_fe *)0x1000003d0,
         ((uVar12 | 0x1000003d0) & uVar15 & (ulong)u32 & (ulong)psVar21 & (uVar16 ^ 0xf000000000000)
         ) == 0xfffffffffffff)) {
        psStack_2b0 = (secp256k1_fe *)0x1238de;
        secp256k1_ellswift_elligatorswift_var_cold_1();
        goto LAB_001238de;
      }
    }
    uVar19 = (ulong)((uint32_t)uVar19 + 1);
    uVar17 = bVar3 >> ((char)uVar17 * '\x04' & 4U) & 7;
    psVar20 = (secp256k1_fe *)(ulong)uVar17;
    psStack_2b0 = (secp256k1_fe *)0x123804;
    psVar18 = psVar20;
    u32 = psStack_2a0;
    iVar11 = secp256k1_ellswift_xswiftec_inv_var
                       ((secp256k1_fe *)psStack_298,&psStack_2a0->x,&sStack_288,uVar17);
    a_00 = psStack_298;
  } while (iVar11 == 0);
  psStack_2b0 = (secp256k1_fe *)0x123819;
  secp256k1_fe_normalize_var((secp256k1_fe *)psStack_298);
  psStack_2b0 = (secp256k1_fe *)0x123821;
  psVar21 = a_00;
  secp256k1_fe_verify((secp256k1_fe *)a_00);
  hasher = a_00;
  if (*(int *)((long)(a_00->initial).x.n + 4) == 0) {
LAB_001238de:
    psStack_2b0 = (secp256k1_fe *)0x1238e3;
    secp256k1_ellswift_elligatorswift_var_cold_4();
  }
  else {
    uVar14 = *(ulong *)a_00;
    psVar20 = &psStack_2a0->y;
    psStack_2b0 = (secp256k1_fe *)0x123841;
    psVar21 = (secp256k1_ecmult_gen_context *)psVar20;
    secp256k1_fe_verify(psVar20);
    elem = psStack_2a0;
    if ((psStack_2a0->y).normalized != 0) {
      uVar17 = (uint)uVar14 ^ (uint)psVar20->n[0];
      uVar14 = (ulong)uVar17;
      if ((uVar17 & 1) == 0) {
        return extraout_EAX;
      }
      psStack_2b0 = (secp256k1_fe *)0x12386c;
      psVar21 = a_00;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      if ((int)(a_00->initial).x.n[0] < 2) {
        uVar4 = (a_00->blind).d[0];
        uVar5 = (a_00->blind).d[1];
        uVar6 = (a_00->blind).d[2];
        *(long *)a_00 = 0x3ffffbfffff0bc - *(long *)a_00;
        (a_00->blind).d[0] = 0x3ffffffffffffc - uVar4;
        (a_00->blind).d[1] = 0x3ffffffffffffc - uVar5;
        (a_00->blind).d[2] = 0x3ffffffffffffc - uVar6;
        (a_00->blind).d[3] = 0x3fffffffffffc - (a_00->blind).d[3];
        (a_00->initial).x.n[0] = 2;
        psStack_2b0 = (secp256k1_fe *)0x1238c3;
        secp256k1_fe_verify((secp256k1_fe *)a_00);
        secp256k1_fe_normalize_var((secp256k1_fe *)a_00);
        return extraout_EAX_00;
      }
      goto LAB_001238e8;
    }
  }
  psStack_2b0 = (secp256k1_fe *)0x1238e8;
  secp256k1_ellswift_elligatorswift_var_cold_3();
LAB_001238e8:
  psStack_2b0 = (secp256k1_fe *)secp256k1_ellswift_create;
  secp256k1_ellswift_elligatorswift_var_cold_2();
  uStack_2d8 = uVar14;
  psStack_2d0 = elem;
  uStack_2c8 = uVar19;
  psStack_2c0 = psVar20;
  psStack_2b8 = hasher;
  psStack_2b0 = &sStack_288;
  if (psVar21 == (secp256k1_ecmult_gen_context *)0x0) {
    secp256k1_ellswift_create_cold_6();
  }
  else if (u32 != (secp256k1_ge *)0x0) {
    (u32->y).n[0] = 0;
    (u32->y).n[1] = 0;
    *(undefined1 (*) [16])((u32->x).n + 4) = (undefined1  [16])0x0;
    (u32->x).n[2] = 0;
    (u32->x).n[3] = 0;
    (u32->x).n[0] = 0;
    (u32->x).n[1] = 0;
    if (psVar21->built == 0) {
      secp256k1_ellswift_create_cold_4();
      return 0;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ellswift_create_cold_3();
      return 0;
    }
    iVar11 = secp256k1_ec_pubkey_create_helper(psVar21,&sStack_328,&sStack_3f8,seckey);
    if ((int)psVar21[1].blind.d[3] != 0) {
      secp256k1_ellswift_create_cold_1();
    }
    secp256k1_fe_normalize_var(&sStack_3f8.x);
    secp256k1_fe_normalize_var(&sStack_3f8.y);
    sStack_390.s[0] = 0xd29e1bf5;
    sStack_390.s[1] = 0xf7025f42;
    sStack_390.s[2] = 0x9b024773;
    sStack_390.s[3] = 0x94cb7d5;
    sStack_390.s[4] = 0xe59ed789;
    sStack_390.s[5] = 0x3bc9786;
    sStack_390.s[6] = 0x68335b35;
    sStack_390.s[7] = 0x4e363b53;
    sStack_390.bytes = 0x40;
    secp256k1_sha256_write(&sStack_390,seckey,0x20);
    secp256k1_sha256_write(&sStack_390,"",0x20);
    if ((int)psVar21[1].blind.d[3] != 0) {
      secp256k1_ellswift_create_cold_2();
    }
    if (psVar18 != (secp256k1_fe *)0x0) {
      secp256k1_sha256_write(&sStack_390,(uchar *)psVar18,0x20);
    }
    secp256k1_ellswift_elligatorswift_var((uchar *)u32,&sStack_308,&sStack_3f8,&sStack_390);
    secp256k1_fe_get_b32((uchar *)((u32->x).n + 4),&sStack_308);
    cVar10 = ((byte)iVar11 ^ 1) - 1;
    auVar22 = ZEXT216(CONCAT11(cVar10,cVar10));
    auVar22 = pshuflw(auVar22,auVar22,0);
    uVar17 = auVar22._0_4_;
    lVar13 = 0;
    do {
      puVar1 = (uint *)((long)(u32->x).n + lVar13);
      uVar7 = puVar1[1];
      uVar8 = puVar1[2];
      uVar9 = puVar1[3];
      puVar2 = (uint *)((long)(u32->x).n + lVar13);
      *puVar2 = *puVar1 & uVar17;
      puVar2[1] = uVar7 & uVar17;
      puVar2[2] = uVar8 & uVar17;
      puVar2[3] = uVar9 & uVar17;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    return iVar11;
  }
  secp256k1_ellswift_create_cold_5();
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal_var(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
#ifdef VERIFY
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(a->magnitude <= 1);
    VERIFY_CHECK(b->magnitude <= 31);
#endif
    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero_var(&na);
}